

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O0

void __thiscall undo::UndoHistory::clearRedo(UndoHistory *this)

{
  UndoState *pUVar1;
  bool bVar2;
  UndoState *prev;
  UndoState *state;
  UndoHistory *this_local;
  
  prev = this->m_last;
  if (this->m_cur == (UndoState *)0x0) {
    this->m_last = (UndoState *)0x0;
    this->m_first = (UndoState *)0x0;
  }
  else {
    this->m_cur->m_next = (UndoState *)0x0;
    this->m_last = this->m_cur;
  }
  while( true ) {
    bVar2 = false;
    if (prev != (UndoState *)0x0) {
      bVar2 = prev != this->m_cur;
    }
    if (!bVar2) break;
    pUVar1 = prev->m_prev;
    deleteState(this,prev);
    prev = pUVar1;
  }
  return;
}

Assistant:

void UndoHistory::clearRedo()
{
  UndoState* state = m_last;

  // First we break the chain of undo states because deleteState() can
  // generate an onDeleteUndoState() notification which might try to
  // iterate over the whole UndoHistory.
  if (m_cur) {
    m_cur->m_next = nullptr;
    m_last = m_cur;
  }
  else {
    m_first = m_last = nullptr;
  }

  for (UndoState* prev = nullptr;
       state && state != m_cur;
       state = prev) {
    prev = state->m_prev;
    deleteState(state);
  }
}